

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O1

void Sle_ManStop(Sle_Man_t *p)

{
  Vec_Bit_t *__ptr;
  Vec_Int_t *pVVar1;
  Vec_Wec_t *pVVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  
  sat_solver_delete(p->pSat);
  __ptr = p->vMask;
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Bit_t *)0x0) {
    free(__ptr);
  }
  pVVar1 = p->vCuts;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar2 = p->vCutFanins;
  if (0 < pVVar2->nCap) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      pvVar3 = *(void **)((long)&pVVar2->pArray->nCap + lVar5);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        *(undefined8 *)((long)&pVVar2->pArray->nCap + lVar5) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < pVVar2->nCap);
  }
  if (pVVar2->pArray != (Vec_Int_t *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (Vec_Int_t *)0x0;
  }
  pVVar2->nCap = 0;
  pVVar2->nSize = 0;
  free(pVVar2);
  pVVar2 = p->vFanoutEdges;
  if (0 < pVVar2->nCap) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      pvVar3 = *(void **)((long)&pVVar2->pArray->nCap + lVar5);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        *(undefined8 *)((long)&pVVar2->pArray->nCap + lVar5) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < pVVar2->nCap);
  }
  if (pVVar2->pArray != (Vec_Int_t *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (Vec_Int_t *)0x0;
  }
  pVVar2->nCap = 0;
  pVVar2->nSize = 0;
  free(pVVar2);
  pVVar2 = p->vEdgeCuts;
  if (0 < pVVar2->nCap) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      pvVar3 = *(void **)((long)&pVVar2->pArray->nCap + lVar5);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        *(undefined8 *)((long)&pVVar2->pArray->nCap + lVar5) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < pVVar2->nCap);
  }
  if (pVVar2->pArray != (Vec_Int_t *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (Vec_Int_t *)0x0;
  }
  pVVar2->nCap = 0;
  pVVar2->nSize = 0;
  free(pVVar2);
  pVVar1 = p->vObjMap;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vCutFirst;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vEdgeFirst;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vDelayFirst;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vPolars;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vLits;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  if (p != (Sle_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Sle_ManStop( Sle_Man_t * p )
{
    sat_solver_delete( p->pSat );
    Vec_BitFree( p->vMask );
    Vec_IntFree( p->vCuts );
    Vec_WecFree( p->vCutFanins );
    Vec_WecFree( p->vFanoutEdges );
    Vec_WecFree( p->vEdgeCuts );
    Vec_IntFree( p->vObjMap );
    Vec_IntFree( p->vCutFirst );
    Vec_IntFree( p->vEdgeFirst );
    Vec_IntFree( p->vDelayFirst );
    Vec_IntFree( p->vPolars );
    Vec_IntFree( p->vLits );
    ABC_FREE( p );
}